

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

pair<std::shared_ptr<void>,_pstore::address> * __thiscall
pstore::transaction_base::alloc_rw
          (pair<std::shared_ptr<void>,_pstore::address> *__return_storage_ptr__,
          transaction_base *this,size_t size,uint align)

{
  int iVar1;
  undefined4 extraout_var;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  value_type vVar2;
  
  iVar1 = (*this->_vptr_transaction_base[2])(this,size,(ulong)align);
  vVar2 = CONCAT44(extraout_var,iVar1);
  (*this->db_->_vptr_database[2])(&local_38,this->db_,vVar2,size,0,1);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  (__return_storage_ptr__->first).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  (__return_storage_ptr__->first).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_30;
  if (local_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->second).a_ = vVar2;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
    (__return_storage_ptr__->second).a_ = vVar2;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<void>, address> transaction_base::alloc_rw (std::size_t const size,
                                                                          unsigned const align) {
        address const addr = this->allocate (size, align);
        // We call database::get() with the initialized parameter set to false because this
        // is new storage: there's no need to copy its existing contents if the block spans
        // more than one region.
        auto ptr = std::const_pointer_cast<void> (db_.get (addr, size,
                                                           false,  // initialized?
                                                           true)); // writable?
        return {ptr, addr};
    }